

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmComputeShaderCase.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)8>_> *
anon_unknown.dwarf_626f6c::createBufferAndBindMemory
          (Move<vk::Handle<(vk::HandleType)8>_> *__return_storage_ptr__,DeviceInterface *vkdi,
          VkDevice *device,Allocator *allocator,size_t numBytes,AllocationMp *outMemory)

{
  VkDevice pVVar1;
  deUint64 dVar2;
  VkResult result;
  Handle<(vk::HandleType)8> *pHVar3;
  Allocation *pAVar4;
  VkDeviceMemory VVar5;
  VkDeviceSize VVar6;
  undefined1 local_b8 [8];
  AllocationMp bufferMemory;
  undefined1 local_90 [8];
  VkMemoryRequirements requirements;
  undefined1 local_70 [8];
  VkBufferCreateInfo bufferCreateInfo;
  AllocationMp *outMemory_local;
  size_t numBytes_local;
  Allocator *allocator_local;
  VkDevice *device_local;
  DeviceInterface *vkdi_local;
  Move<vk::Handle<(vk::HandleType)8>_> *buffer;
  
  local_70._0_4_ = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext._0_4_ = 0;
  bufferCreateInfo.size._0_4_ = 0x20;
  bufferCreateInfo.size._4_4_ = 0;
  bufferCreateInfo.usage = 0;
  bufferCreateInfo.queueFamilyIndexCount = 0;
  bufferCreateInfo._44_4_ = 0;
  requirements._23_1_ = 0;
  bufferCreateInfo._16_8_ = numBytes;
  bufferCreateInfo.pQueueFamilyIndices = (deUint32 *)outMemory;
  ::vk::createBuffer(__return_storage_ptr__,vkdi,*device,(VkBufferCreateInfo *)local_70,
                     (VkAllocationCallbacks *)0x0);
  pVVar1 = *device;
  pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     (&__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  ::vk::getBufferMemoryRequirements
            ((VkMemoryRequirements *)local_90,vkdi,pVVar1,(VkBuffer)pHVar3->m_internal);
  (*allocator->_vptr_Allocator[3])
            (local_b8,allocator,local_90,(ulong)::vk::MemoryRequirement::HostVisible);
  pVVar1 = *device;
  pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     (&__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  dVar2 = pHVar3->m_internal;
  pAVar4 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_b8);
  VVar5 = ::vk::Allocation::getMemory(pAVar4);
  pAVar4 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_b8);
  VVar6 = ::vk::Allocation::getOffset(pAVar4);
  result = (*vkdi->_vptr_DeviceInterface[0xc])(vkdi,pVVar1,dVar2,VVar5.m_internal,VVar6);
  ::vk::checkResult(result,
                    "vkdi.bindBufferMemory(device, *buffer, bufferMemory->getMemory(), bufferMemory->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/spirv_assembly/vktSpvAsmComputeShaderCase.cpp"
                    ,0x46);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
             bufferCreateInfo.pQueueFamilyIndices,
             (MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_b8);
  requirements._23_1_ = 1;
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_b8);
  if ((requirements._23_1_ & 1) == 0) {
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Move<VkBuffer> createBufferAndBindMemory (const DeviceInterface& vkdi, const VkDevice& device, Allocator& allocator, size_t numBytes, AllocationMp* outMemory)
{
	const VkBufferCreateInfo bufferCreateInfo =
	{
		VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,	// sType
		DE_NULL,								// pNext
		0u,										// flags
		numBytes,								// size
		VK_BUFFER_USAGE_STORAGE_BUFFER_BIT,		// usage
		VK_SHARING_MODE_EXCLUSIVE,				// sharingMode
		0u,										// queueFamilyCount
		DE_NULL,								// pQueueFamilyIndices
	};

	Move<VkBuffer>				buffer			(createBuffer(vkdi, device, &bufferCreateInfo));
	const VkMemoryRequirements	requirements	= getBufferMemoryRequirements(vkdi, device, *buffer);
	AllocationMp				bufferMemory	= allocator.allocate(requirements, MemoryRequirement::HostVisible);

	VK_CHECK(vkdi.bindBufferMemory(device, *buffer, bufferMemory->getMemory(), bufferMemory->getOffset()));
	*outMemory = bufferMemory;

	return buffer;
}